

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O1

void __thiscall QHttpMultiPartPrivate::QHttpMultiPartPrivate(QHttpMultiPartPrivate *this)

{
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  QHttpMultiPartIODevice *this_00;
  void *pvVar4;
  long in_FS_OFFSET;
  QArrayData *local_b0;
  undefined1 **local_a8;
  undefined8 local_a0;
  QArrayData *local_98;
  char *pcStack_90;
  qsizetype local_88;
  QStringBuilder<const_char_(&)[16],_QByteArray> local_78;
  QByteArray local_58;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QHttpMultiPartPrivate_002d3530;
  (this->parts).d.d = (Data *)0x0;
  (this->parts).d.ptr = (QHttpPart *)0x0;
  (this->parts).d.size = 0;
  (this->boundary).d.d = (Data *)0x0;
  (this->boundary).d.ptr = (char *)0x0;
  (this->boundary).d.size = 0;
  this->contentType = MixedType;
  this_00 = (QHttpMultiPartIODevice *)operator_new(0x40);
  QIODevice::QIODevice((QIODevice *)this_00);
  *(undefined ***)this_00 = &PTR_metaObject_002d3560;
  this_00->multiPart = this;
  this_00->readPointer = 0;
  (this_00->partOffsets).d.d = (Data *)0x0;
  (this_00->partOffsets).d.ptr = (longlong *)0x0;
  (this_00->partOffsets).d.size = 0;
  this_00->deviceSize = -1;
  this->device = this_00;
  pvVar4 = (void *)QRandomGenerator64::global();
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QRandomGenerator::_fillRange(pvVar4,(longlong)&local_38);
  local_b0 = (QArrayData *)0x0;
  local_a0 = 0x18;
  local_a8 = &local_38;
  QByteArray::toBase64(&local_98,&local_b0,0);
  local_78.b.d.size = local_88;
  local_78.b.d.ptr = pcStack_90;
  local_78.b.d.d = (Data *)local_98;
  local_78.a = (char (*) [16])0x26d8b1;
  local_98 = (QArrayData *)0x0;
  pcStack_90 = (char *)0x0;
  local_88 = 0;
  QStringBuilder<const_char_(&)[16],_QByteArray>::convertTo<QByteArray>(&local_58,&local_78);
  pQVar1 = &((this->boundary).d.d)->super_QArrayData;
  pcVar2 = (this->boundary).d.ptr;
  *(undefined4 *)&(this->boundary).d.d = local_58.d.d._0_4_;
  *(undefined4 *)((long)&(this->boundary).d.d + 4) = local_58.d.d._4_4_;
  *(undefined4 *)&(this->boundary).d.ptr = local_58.d.ptr._0_4_;
  *(undefined4 *)((long)&(this->boundary).d.ptr + 4) = local_58.d.ptr._4_4_;
  qVar3 = (this->boundary).d.size;
  (this->boundary).d.size = local_58.d.size;
  local_58.d.d = (Data *)pQVar1;
  local_58.d.ptr = pcVar2;
  local_58.d.size = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  if (&(local_78.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.b.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,1,0x10);
    }
  }
  if (local_b0 != (QArrayData *)0x0) {
    LOCK();
    (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b0,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpMultiPartPrivate::QHttpMultiPartPrivate() : contentType(QHttpMultiPart::MixedType), device(new QHttpMultiPartIODevice(this))
{
    // 24 random bytes, becomes 32 characters when encoded to Base64
    quint32 random[6];
    QRandomGenerator::global()->fillRange(random);
    boundary = "boundary_.oOo._"
               + QByteArray::fromRawData(reinterpret_cast<char *>(random), sizeof(random)).toBase64();

    // boundary must not be longer than 70 characters, see RFC 2046, section 5.1.1
    Q_ASSERT(boundary.size() <= 70);
}